

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__gif_header(stbi__context *s,stbi__gif *g,int *comp,int is_info)

{
  long lVar1;
  stbi_uc sVar2;
  int iVar3;
  uint uVar4;
  stbi_uc *psVar5;
  byte *pbVar6;
  char *pcVar7;
  byte bVar8;
  long *in_FS_OFFSET;
  bool bVar9;
  
  psVar5 = s->img_buffer;
  if (s->img_buffer_end <= psVar5) {
    if (s->read_from_callbacks == 0) goto LAB_001c126f;
    stbi__refill_buffer(s);
    psVar5 = s->img_buffer;
  }
  s->img_buffer = psVar5 + 1;
  if (*psVar5 != 'G') goto LAB_001c126f;
  psVar5 = s->img_buffer;
  if (s->img_buffer_end <= psVar5) {
    if (s->read_from_callbacks == 0) goto LAB_001c126f;
    stbi__refill_buffer(s);
    psVar5 = s->img_buffer;
  }
  s->img_buffer = psVar5 + 1;
  if (*psVar5 != 'I') goto LAB_001c126f;
  psVar5 = s->img_buffer;
  if (s->img_buffer_end <= psVar5) {
    if (s->read_from_callbacks == 0) goto LAB_001c126f;
    stbi__refill_buffer(s);
    psVar5 = s->img_buffer;
  }
  s->img_buffer = psVar5 + 1;
  if (*psVar5 != 'F') goto LAB_001c126f;
  psVar5 = s->img_buffer;
  if (s->img_buffer_end <= psVar5) {
    if (s->read_from_callbacks == 0) goto LAB_001c126f;
    stbi__refill_buffer(s);
    psVar5 = s->img_buffer;
  }
  s->img_buffer = psVar5 + 1;
  if (*psVar5 != '8') goto LAB_001c126f;
  psVar5 = s->img_buffer;
  if (psVar5 < s->img_buffer_end) {
LAB_001c1108:
    s->img_buffer = psVar5 + 1;
    sVar2 = *psVar5;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar5 = s->img_buffer;
      goto LAB_001c1108;
    }
    sVar2 = '\0';
  }
  if ((sVar2 != '7') && (sVar2 != '9')) {
LAB_001c126f:
    *(char **)(*in_FS_OFFSET + -0x20) = "not GIF";
    return 0;
  }
  psVar5 = s->img_buffer;
  if (psVar5 < s->img_buffer_end) {
LAB_001c114f:
    s->img_buffer = psVar5 + 1;
    bVar9 = *psVar5 == 'a';
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar5 = s->img_buffer;
      goto LAB_001c114f;
    }
    bVar9 = false;
  }
  lVar1 = *in_FS_OFFSET;
  if (!bVar9) {
    pcVar7 = "not GIF";
    goto LAB_001c12a5;
  }
  *(undefined8 *)(lVar1 + -0x20) = "";
  iVar3 = stbi__get16le(s);
  g->w = iVar3;
  iVar3 = stbi__get16le(s);
  g->h = iVar3;
  pbVar6 = s->img_buffer;
  if (pbVar6 < s->img_buffer_end) {
LAB_001c11c7:
    s->img_buffer = pbVar6 + 1;
    uVar4 = (uint)*pbVar6;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar6 = s->img_buffer;
      goto LAB_001c11c7;
    }
    uVar4 = 0;
  }
  g->flags = uVar4;
  pbVar6 = s->img_buffer;
  if (pbVar6 < s->img_buffer_end) {
LAB_001c1202:
    s->img_buffer = pbVar6 + 1;
    uVar4 = (uint)*pbVar6;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar6 = s->img_buffer;
      goto LAB_001c1202;
    }
    uVar4 = 0;
  }
  g->bgindex = uVar4;
  pbVar6 = s->img_buffer;
  if (pbVar6 < s->img_buffer_end) {
LAB_001c123d:
    s->img_buffer = pbVar6 + 1;
    uVar4 = (uint)*pbVar6;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar6 = s->img_buffer;
      goto LAB_001c123d;
    }
    uVar4 = 0;
  }
  g->ratio = uVar4;
  g->transparent = -1;
  if ((g->w < 0x1000001) && (g->h < 0x1000001)) {
    if (comp != (int *)0x0) {
      *comp = 4;
    }
    if (is_info == 0) {
      bVar8 = (byte)g->flags;
      if ((char)bVar8 < '\0') {
        stbi__gif_parse_colortable(s,g->pal,2 << (bVar8 & 7),-1);
        return 1;
      }
      return 1;
    }
    return 1;
  }
  pcVar7 = "too large";
LAB_001c12a5:
  *(undefined8 *)(lVar1 + -0x20) = pcVar7;
  return 0;
}

Assistant:

static int stbi__gif_header(stbi__context *s, stbi__gif *g, int *comp, int is_info)
{
   stbi_uc version;
   if (stbi__get8(s) != 'G' || stbi__get8(s) != 'I' || stbi__get8(s) != 'F' || stbi__get8(s) != '8')
      return stbi__err("not GIF", "Corrupt GIF");

   version = stbi__get8(s);
   if (version != '7' && version != '9')    return stbi__err("not GIF", "Corrupt GIF");
   if (stbi__get8(s) != 'a')                return stbi__err("not GIF", "Corrupt GIF");

   stbi__g_failure_reason = "";
   g->w = stbi__get16le(s);
   g->h = stbi__get16le(s);
   g->flags = stbi__get8(s);
   g->bgindex = stbi__get8(s);
   g->ratio = stbi__get8(s);
   g->transparent = -1;

   if (g->w > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (g->h > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");

   if (comp != 0) *comp = 4;  // can't actually tell whether it's 3 or 4 until we parse the comments

   if (is_info) return 1;

   if (g->flags & 0x80)
      stbi__gif_parse_colortable(s,g->pal, 2 << (g->flags & 7), -1);

   return 1;
}